

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov2.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  Allocator **ppAVar1;
  undefined1 auVar2 [16];
  char *pcVar3;
  float fVar4;
  int *piVar5;
  pointer pOVar6;
  char cVar7;
  float fVar8;
  size_t sVar9;
  long lVar10;
  int iVar11;
  float fVar12;
  ulong uVar13;
  __m128 t_2;
  __m128 t;
  int baseLine;
  undefined1 local_2f8 [12];
  float fStack_2ec;
  undefined8 local_2e8;
  vector<Object,_std::allocator<Object>_> objects;
  float mean_vals [3];
  Size label_size;
  float norm_vals [3];
  float local_280;
  int local_27c;
  Mat local_278;
  Mat local_238;
  Extractor ex;
  Mat m;
  int local_190;
  int local_18c;
  uchar *local_188;
  Net yolov2;
  
  if (argc == 2) {
    pcVar3 = argv[1];
    std::__cxx11::string::string((string *)&yolov2,pcVar3,(allocator *)&ex);
    cv::imread((string *)&m,(int)&yolov2);
    if ((Allocator **)yolov2.opt._0_8_ != &yolov2.opt.workspace_allocator) {
      operator_delete((void *)yolov2.opt._0_8_);
    }
    cVar7 = cv::Mat::empty();
    if (cVar7 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&yolov2);
      ncnn::Net::load_param(&yolov2,"mobilenet_yolo.param");
      ncnn::Net::load_model(&yolov2,"mobilenet_yolo.bin");
      ncnn::Mat::from_pixels_resize
                (&local_278,local_188,2,local_18c,local_190,0x1a0,0x1a0,(Allocator *)0x0);
      mean_vals[0] = 1.0;
      mean_vals[1] = 1.0;
      mean_vals[2] = 1.0;
      norm_vals[0] = 0.007843;
      norm_vals[1] = 0.007843;
      norm_vals[2] = 0.007843;
      ncnn::Mat::substract_mean_normalize(&local_278,(float *)0x0,norm_vals);
      ncnn::Mat::substract_mean_normalize(&local_278,mean_vals,(float *)0x0);
      ncnn::Net::create_extractor(&ex,&yolov2);
      ncnn::Extractor::set_num_threads(&ex,4);
      ncnn::Extractor::input(&ex,"data",&local_278);
      local_238.elemsize._0_4_ = 0;
      local_238.elemsize._4_4_ = 0;
      local_238.elempack = 0;
      local_238.data = (void *)0x0;
      local_238.refcount._0_4_ = 0;
      local_238.refcount._4_4_ = 0;
      local_238.allocator = (Allocator *)0x0;
      local_238.dims = 0;
      local_238.w = 0;
      local_238.h = 0;
      local_238.c = 0;
      local_238.cstep = 0;
      ncnn::Extractor::extract(&ex,"detection_out",&local_238);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
        _M_finish = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      if (0 < local_238.h) {
        iVar11 = 0;
        do {
          lVar10 = (long)iVar11 * (long)local_238.w *
                   CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
          local_2e8._4_4_ = *(float *)((long)local_238.data + lVar10 + 4);
          local_2e8._0_4_ = (int)*(float *)((long)local_238.data + lVar10);
          local_2f8._0_4_ = *(float *)((long)local_238.data + lVar10 + 8) * (float)local_18c;
          local_2f8._4_4_ = *(float *)((long)local_238.data + lVar10 + 0xc) * (float)local_190;
          stack0xfffffffffffffd10 =
               (Extractor *)
               CONCAT44(*(float *)((long)local_238.data + lVar10 + 0x14) * (float)local_190 -
                        (float)local_2f8._4_4_,
                        *(float *)((long)local_238.data + lVar10 + 0x10) * (float)local_18c -
                        (float)local_2f8._0_4_);
          std::vector<Object,_std::allocator<Object>_>::push_back(&objects,(value_type *)local_2f8);
          iVar11 = iVar11 + 1;
        } while (iVar11 < local_238.h);
      }
      piVar5 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_238.allocator == (Allocator *)0x0) {
            if (local_238.data != (void *)0x0) {
              free(local_238.data);
            }
          }
          else {
            (**(code **)(*(long *)local_238.allocator + 0x18))();
          }
        }
      }
      ncnn::Extractor::~Extractor(&ex);
      if ((Extractor *)local_278.refcount != (Extractor *)0x0) {
        LOCK();
        *(int *)(Net **)local_278.refcount = *(int *)(Net **)local_278.refcount + -1;
        UNLOCK();
        if (*(int *)(Net **)local_278.refcount == 0) {
          if (local_278.allocator == (Allocator *)0x0) {
            if ((size_t *)local_278.data != (size_t *)0x0) {
              free(local_278.data);
            }
          }
          else {
            (**(code **)(*(long *)local_278.allocator + 0x18))();
          }
        }
      }
      ncnn::Net::~Net(&yolov2);
      cv::Mat::clone();
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar10 = 0;
        uVar13 = 0;
        do {
          pOVar6 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                   super__Vector_impl_data._M_start;
          fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                  SUB84((double)*(float *)((long)&(objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->prob +
                                          lVar10),0),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).x +
                                    lVar10),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).y +
                                    lVar10),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).width
                                    + lVar10),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).
                                            height + lVar10),
                  (ulong)*(uint *)((long)&(objects.
                                           super__Vector_base<Object,_std::allocator<Object>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->label + lVar10
                                  ));
          local_278.elemsize = 0;
          local_278.data = (void *)CONCAT44(local_278.data._4_4_,0x3010000);
          auVar2 = *(undefined1 (*) [16])((long)&(pOVar6->rect).x + lVar10);
          mean_vals[2] = (float)(int)ROUND(auVar2._8_4_);
          mean_vals[1] = (float)(int)ROUND(auVar2._4_4_);
          mean_vals[0] = (float)(int)ROUND(auVar2._0_4_);
          yolov2.opt.lightmode = false;
          yolov2.opt._1_3_ = 0;
          yolov2.opt.num_threads = 0x406fe000;
          yolov2.opt.use_winograd_convolution = false;
          yolov2.opt.use_sgemm_convolution = false;
          yolov2.opt.use_int8_inference = false;
          yolov2.opt.use_vulkan_compute = false;
          yolov2.opt.use_fp16_packed = false;
          yolov2.opt.use_fp16_storage = false;
          yolov2.opt.use_fp16_arithmetic = false;
          yolov2.opt.use_int8_storage = false;
          yolov2.opt.blob_allocator = (Allocator *)0x0;
          yolov2.opt.workspace_allocator = (Allocator *)0x0;
          local_278.refcount = (int *)&ex;
          cv::rectangle(&local_278,mean_vals,&yolov2,1,8,0);
          sprintf((char *)&yolov2,"%s %.1f%%",
                  SUB84((double)(*(float *)((long)&pOVar6->prob + lVar10) * 100.0),0),
                  _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel +
                  *(int *)(
                          _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel
                          + (long)*(int *)((long)&pOVar6->label + lVar10) * 4));
          local_278.data = &local_278.elemsize;
          sVar9 = strlen((char *)&yolov2);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,&yolov2,&yolov2.opt.lightmode + sVar9);
          cv::getTextSize((string *)&label_size,(int)&local_278,0.5,0,(int *)0x1);
          if ((size_t *)local_278.data != &local_278.elemsize) {
            operator_delete(local_278.data);
          }
          fVar8 = (float)(int)*(float *)((long)&(pOVar6->rect).x + lVar10);
          fVar12 = (float)(int)((*(float *)((long)&(pOVar6->rect).y + lVar10) -
                                (float)label_size.height) - 0.0);
          if ((int)fVar12 < 1) {
            fVar12 = 0.0;
          }
          fVar4 = (float)(ex.blob_mats.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_start._4_4_ - label_size.width);
          if (label_size.width + (int)fVar8 <=
              ex.blob_mats.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_) {
            fVar4 = fVar8;
          }
          local_2e8._0_4_ = 0;
          local_2e8._4_4_ = 0.0;
          local_2f8._0_4_ = 3.7909693e-37;
          norm_vals[1] = fVar12;
          norm_vals[0] = fVar4;
          norm_vals[2] = (float)label_size.width;
          local_278.data = (void *)0x406fe00000000000;
          local_278.refcount = (int *)0x406fe00000000000;
          local_278.elemsize = 0x406fe00000000000;
          local_278.elempack = 0;
          local_278._28_4_ = 0;
          unique0x10000be9 = &ex;
          cv::rectangle(local_2f8,norm_vals,&local_278,0xffffffff,8,0);
          local_2e8._0_4_ = 0;
          local_2e8._4_4_ = 0.0;
          local_2f8._0_4_ = 3.7909693e-37;
          unique0x10000bf1 = &ex;
          local_278.data = &local_278.elemsize;
          sVar9 = strlen((char *)&yolov2);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,&yolov2,&yolov2.opt.lightmode + sVar9);
          local_27c = (int)fVar12 + label_size.height;
          local_238.data = (void *)0x0;
          local_238.refcount._0_4_ = 0;
          local_238.refcount._4_4_ = 0;
          local_238.elemsize._0_4_ = 0;
          local_238.elemsize._4_4_ = 0;
          local_238.elempack = 0;
          local_238._28_4_ = 0;
          local_280 = fVar4;
          cv::putText(0,local_2f8,&local_278,&local_280,0,&local_238,1,8,0);
          if ((size_t *)local_278.data != &local_278.elemsize) {
            operator_delete(local_278.data);
          }
          uVar13 = uVar13 + 1;
          lVar10 = lVar10 + 0x18;
        } while (uVar13 < (ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      local_278.refcount = (int *)&ex;
      ppAVar1 = &yolov2.opt.workspace_allocator;
      yolov2.opt.workspace_allocator =
           (Allocator *)CONCAT26(yolov2.opt.workspace_allocator._6_2_,0x6567616d69);
      yolov2.opt.blob_allocator = (Allocator *)0x5;
      local_278.elemsize = 0;
      local_278.data = (void *)CONCAT44(local_278.data._4_4_,0x1010000);
      yolov2.opt._0_8_ = ppAVar1;
      cv::imshow((string *)&yolov2,(_InputArray *)&local_278);
      if ((Allocator **)yolov2.opt._0_8_ != ppAVar1) {
        operator_delete((void *)yolov2.opt._0_8_);
      }
      cv::waitKey(0);
      cv::Mat::~Mat((Mat *)&ex);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar11 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar3);
      iVar11 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    main_cold_1();
    iVar11 = -1;
  }
  return iVar11;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

#if NCNN_VULKAN
    ncnn::create_gpu_instance();
#endif // NCNN_VULKAN

    std::vector<Object> objects;
    detect_yolov2(m, objects);

#if NCNN_VULKAN
    ncnn::destroy_gpu_instance();
#endif // NCNN_VULKAN

    draw_objects(m, objects);

    return 0;
}